

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtManifoldResult.cpp
# Opt level: O2

void __thiscall
cbtManifoldResult::addContactPoint
          (cbtManifoldResult *this,cbtVector3 *normalOnBInWorld,cbtVector3 *pointInWorld,
          cbtScalar depth)

{
  cbtCollisionObject *pcVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject *pcVar3;
  cbtCollisionObjectWrapper *pcVar4;
  cbtCollisionObjectWrapper *pcVar5;
  int insertIndex;
  uint uVar6;
  cbtCollisionObjectWrapper *pcVar7;
  cbtCollisionObjectWrapper **ppcVar8;
  bool bVar9;
  cbtScalar cVar10;
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar22 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  cbtVector3 cVar23;
  cbtVector3 cVar24;
  cbtVector3 pointA;
  cbtScalar local_14c;
  cbtCollisionObject *local_148;
  int local_13c;
  cbtVector3 local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [112];
  cbtScalar cStack_a8;
  cbtScalar cStack_a4;
  cbtScalar cStack_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  void *pvStack_88;
  byte local_80;
  undefined7 uStack_7f;
  undefined1 local_78 [16];
  anon_union_4_2_6ad150e0_for_cbtManifoldPoint_22 aStack_68;
  anon_union_4_2_42dea85c_for_cbtManifoldPoint_24 aStack_64;
  undefined8 uStack_60;
  cbtVector3 local_58;
  cbtVector3 local_48;
  undefined1 auVar11 [16];
  undefined1 auVar17 [56];
  
  local_148 = (cbtCollisionObject *)CONCAT44(local_148._4_4_,depth);
  local_14c = depth;
  cVar10 = cbtPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
  auVar22 = (undefined1  [56])0x0;
  if (local_148._0_4_ <= cVar10) {
    pcVar1 = this->m_manifoldPtr->m_body0;
    local_13c = this->m_manifoldPtr->m_cachedPoints;
    pcVar2 = this->m_body0Wrap->m_collisionObject;
    auVar17 = extraout_var;
    cVar23 = ::operator*(normalOnBInWorld,&local_14c);
    auVar18._0_8_ = cVar23.m_floats._8_8_;
    auVar18._8_56_ = auVar22;
    auVar12._0_8_ = cVar23.m_floats._0_8_;
    auVar12._8_56_ = auVar17;
    local_118._0_16_ = vmovlhps_avx(auVar12._0_16_,auVar18._0_16_);
    auVar17 = ZEXT856(local_118._8_8_);
    cVar23 = ::operator+(pointInWorld,(cbtVector3 *)local_118);
    auVar19._0_8_ = cVar23.m_floats._8_8_;
    auVar19._8_56_ = auVar22;
    auVar13._0_8_ = cVar23.m_floats._0_8_;
    auVar13._8_56_ = auVar17;
    local_138.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13._0_16_,auVar19._0_16_);
    auVar17 = ZEXT856(local_138.m_floats._8_8_);
    local_148 = pcVar1;
    if (pcVar1 == pcVar2) {
      cVar23 = cbtTransform::invXform
                         (&this->m_body0Wrap->m_collisionObject->m_worldTransform,&local_138);
      auVar20._0_8_ = cVar23.m_floats._8_8_;
      auVar20._8_56_ = auVar22;
      auVar15._0_8_ = cVar23.m_floats._0_8_;
      auVar15._8_56_ = auVar17;
      auVar11 = auVar15._0_16_;
      ppcVar8 = &this->m_body1Wrap;
    }
    else {
      ppcVar8 = &this->m_body0Wrap;
      cVar23 = cbtTransform::invXform
                         (&this->m_body1Wrap->m_collisionObject->m_worldTransform,&local_138);
      auVar20._0_8_ = cVar23.m_floats._8_8_;
      auVar20._8_56_ = auVar22;
      auVar14._0_8_ = cVar23.m_floats._0_8_;
      auVar14._8_56_ = auVar17;
      auVar11 = auVar14._0_16_;
    }
    auVar17 = auVar20._8_56_;
    local_128 = vmovlhps_avx(auVar11,auVar20._0_16_);
    auVar22 = ZEXT856(local_128._8_8_);
    cVar24 = cbtTransform::invXform(&(*ppcVar8)->m_collisionObject->m_worldTransform,pointInWorld);
    cVar23.m_floats = local_138.m_floats;
    auVar21._0_8_ = cVar24.m_floats._8_8_;
    auVar21._8_56_ = auVar17;
    auVar16._0_8_ = cVar24.m_floats._0_8_;
    auVar16._8_56_ = auVar22;
    local_118._40_16_ = vmovlhps_avx(auVar16._0_16_,auVar21._0_16_);
    local_118._24_8_ = local_128._0_8_;
    local_118._32_8_ = local_128._8_8_;
    local_118._88_8_ = *(undefined8 *)normalOnBInWorld->m_floats;
    local_118._96_8_ = *(undefined8 *)(normalOnBInWorld->m_floats + 2);
    local_118._0_16_ = ZEXT816(0) << 0x20;
    local_118._104_4_ = local_14c;
    local_118._16_4_ = 0.0;
    local_118._20_4_ = 0.0;
    pvStack_88 = (void *)0x0;
    aStack_68.m_contactCFM = 0.0;
    aStack_64.m_contactERP = 0.0;
    uStack_60._0_4_ = 0.0;
    uStack_60._4_4_ = 0;
    local_80 = 0;
    uStack_7f = SUB327(ZEXT832(0),5);
    local_78 = (undefined1  [16])0x0;
    local_118._72_4_ = local_138.m_floats[0];
    local_118._76_4_ = local_138.m_floats[1];
    local_118._80_4_ = local_138.m_floats[2];
    local_118._84_4_ = local_138.m_floats[3];
    local_118._56_8_ = *(undefined8 *)pointInWorld->m_floats;
    local_118._64_8_ = *(undefined8 *)(pointInWorld->m_floats + 2);
    local_138.m_floats = cVar23.m_floats;
    unique0x10000822 = (cbtScalar  [4])local_118._0_16_;
    insertIndex = cbtPersistentManifold::getCacheEntry
                            (this->m_manifoldPtr,(cbtManifoldPoint *)local_118);
    cVar10 = (*gCalculateCombinedFrictionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    local_118._108_4_ = cVar10;
    cVar10 = (*gCalculateCombinedRestitutionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    cStack_a0 = cVar10;
    cVar10 = (*gCalculateCombinedRollingFrictionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    cStack_a8 = cVar10;
    cVar10 = (*gCalculateCombinedSpinningFrictionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    cStack_a4 = cVar10;
    pcVar1 = this->m_body0Wrap->m_collisionObject;
    pcVar3 = this->m_body1Wrap->m_collisionObject;
    uVar6 = pcVar1->m_collisionFlags;
    if (((char)uVar6 < '\0') || ((pcVar3->m_collisionFlags & 0x80) != 0)) {
      aStack_64.m_contactERP = (*gCalculateCombinedContactDampingCallback)(pcVar1,pcVar3);
      aStack_68.m_contactCFM =
           (*gCalculateCombinedContactStiffnessCallback)
                     (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
      local_80 = local_80 | 8;
      uVar6 = this->m_body0Wrap->m_collisionObject->m_collisionFlags;
    }
    if (((uVar6 >> 9 & 1) != 0) ||
       ((this->m_body1Wrap->m_collisionObject->m_collisionFlags & 0x200) != 0)) {
      local_80 = local_80 | 0x10;
    }
    bVar9 = local_148 == pcVar2;
    cbtPlaneSpace1<cbtVector3>((cbtVector3 *)(local_118 + 0x58),&local_58,&local_48);
    local_98 = (&this->m_partId0)[bVar9];
    local_90 = (&this->m_index0)[bVar9];
    local_9c = (&this->m_partId0)[!bVar9];
    local_94 = (&this->m_index0)[!bVar9];
    if (insertIndex < 0) {
      insertIndex = cbtPersistentManifold::addManifoldPoint
                              (this->m_manifoldPtr,(cbtManifoldPoint *)local_118,false);
    }
    else {
      cbtPersistentManifold::replaceContactPoint
                (this->m_manifoldPtr,(cbtManifoldPoint *)local_118,insertIndex);
    }
    if (gContactAddedCallback != (ContactAddedCallback)0x0) {
      pcVar4 = this->m_body0Wrap;
      pcVar5 = this->m_body1Wrap;
      if (((pcVar4->m_collisionObject->m_collisionFlags & 8) != 0) ||
         ((pcVar5->m_collisionObject->m_collisionFlags & 8) != 0)) {
        pcVar7 = pcVar4;
        if (local_148 == pcVar2) {
          pcVar7 = pcVar5;
          pcVar5 = pcVar4;
        }
        (*gContactAddedCallback)
                  (this->m_manifoldPtr->m_pointCache + insertIndex,pcVar5,local_9c,local_94,pcVar7,
                   local_98,local_90);
      }
    }
    if (gContactStartedCallback != (ContactStartedCallback)0x0 && local_13c == 0) {
      (*gContactStartedCallback)(&this->m_manifoldPtr);
    }
  }
  return;
}

Assistant:

void cbtManifoldResult::addContactPoint(const cbtVector3& normalOnBInWorld, const cbtVector3& pointInWorld, cbtScalar depth)
{
	cbtAssert(m_manifoldPtr);
	//order in manifold needs to match

	if (depth > m_manifoldPtr->getContactBreakingThreshold()) {
		//	if (depth > m_manifoldPtr->getContactProcessingThreshold())
		return;
	}
	bool isSwapped = m_manifoldPtr->getBody0() != m_body0Wrap->getCollisionObject();
	bool isNewCollision = m_manifoldPtr->getNumContacts() == 0;

	cbtVector3 pointA = pointInWorld + normalOnBInWorld * depth;

	cbtVector3 localA;
	cbtVector3 localB;

	if (isSwapped)
	{
		localA = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointA);
		localB = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
	}
	else
	{
		localA = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointA);
		localB = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
	}

	cbtManifoldPoint newPt(localA, localB, normalOnBInWorld, depth);
	newPt.m_positionWorldOnA = pointA;
	newPt.m_positionWorldOnB = pointInWorld;

	int insertIndex = m_manifoldPtr->getCacheEntry(newPt);

	newPt.m_combinedFriction = gCalculateCombinedFrictionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
	newPt.m_combinedRestitution = gCalculateCombinedRestitutionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
	newPt.m_combinedRollingFriction = gCalculateCombinedRollingFrictionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
	newPt.m_combinedSpinningFriction = gCalculateCombinedSpinningFrictionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());

	if ((m_body0Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_CONTACT_STIFFNESS_DAMPING) ||
		(m_body1Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_CONTACT_STIFFNESS_DAMPING))
	{
		newPt.m_combinedContactDamping1 = gCalculateCombinedContactDampingCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
		newPt.m_combinedContactStiffness1 = gCalculateCombinedContactStiffnessCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
		newPt.m_contactPointFlags |= BT_CONTACT_FLAG_CONTACT_STIFFNESS_DAMPING;
	}

	if ((m_body0Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_FRICTION_ANCHOR) ||
		(m_body1Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_FRICTION_ANCHOR))
	{
		newPt.m_contactPointFlags |= BT_CONTACT_FLAG_FRICTION_ANCHOR;
	}

	cbtPlaneSpace1(newPt.m_normalWorldOnB, newPt.m_lateralFrictionDir1, newPt.m_lateralFrictionDir2);

	//BP mod, store contact triangles.
	if (isSwapped)
	{
		newPt.m_partId0 = m_partId1;
		newPt.m_partId1 = m_partId0;
		newPt.m_index0 = m_index1;
		newPt.m_index1 = m_index0;
	}
	else
	{
		newPt.m_partId0 = m_partId0;
		newPt.m_partId1 = m_partId1;
		newPt.m_index0 = m_index0;
		newPt.m_index1 = m_index1;
	}
	//printf("depth=%f\n",depth);
	///@todo, check this for any side effects
	if (insertIndex >= 0)
	{
		//const cbtManifoldPoint& oldPoint = m_manifoldPtr->getContactPoint(insertIndex);
		m_manifoldPtr->replaceContactPoint(newPt, insertIndex);
	}
	else
	{
		insertIndex = m_manifoldPtr->addManifoldPoint(newPt);
	}

	//User can override friction and/or restitution
	if (gContactAddedCallback &&
		//and if either of the two bodies requires custom material
		((m_body0Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK) ||
		 (m_body1Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK)))
	{
		//experimental feature info, for per-triangle material etc.
		const cbtCollisionObjectWrapper* obj0Wrap = isSwapped ? m_body1Wrap : m_body0Wrap;
		const cbtCollisionObjectWrapper* obj1Wrap = isSwapped ? m_body0Wrap : m_body1Wrap;
		(*gContactAddedCallback)(m_manifoldPtr->getContactPoint(insertIndex), obj0Wrap, newPt.m_partId0, newPt.m_index0, obj1Wrap, newPt.m_partId1, newPt.m_index1);
	}

	if (gContactStartedCallback && isNewCollision)
	{
		gContactStartedCallback(m_manifoldPtr);
	}
}